

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O3

void __thiscall
glslang::TSymbolTableLevel::findFunctionNameList
          (TSymbolTableLevel *this,TString *name,TVector<const_glslang::TFunction_*> *list)

{
  pointer __s;
  uint uVar1;
  void *pvVar2;
  _Base_ptr p_Var3;
  ulong uVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  const_iterator it;
  TString base;
  TFunction *local_60;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_58;
  
  if (name->_M_string_length == 0) {
    uVar4 = 0xffffffffffffffff;
  }
  else {
    __s = (name->_M_dataplus)._M_p;
    pvVar2 = memchr(__s,0x28,name->_M_string_length);
    uVar4 = -(ulong)(pvVar2 == (void *)0x0) | (long)pvVar2 - (long)__s;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  basic_string(&local_58,name,0,uVar4 + 1);
  p_Var5 = (this->level)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &(this->level)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var3 = p_Var6;
  if (p_Var5 != (_Base_ptr)0x0) {
    do {
      uVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          *)(p_Var5 + 1),&local_58);
      if (-1 < (int)uVar1) {
        p_Var3 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[uVar1 >> 0x1f];
    } while (p_Var5 != (_Base_ptr)0x0);
  }
  local_58._M_dataplus._M_p[uVar4] = ')';
  p_Var5 = (this->level)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var5 != (_Base_ptr)0x0) {
    do {
      uVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (&local_58,
                         (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          *)(p_Var5 + 1));
      if ((int)uVar1 < 0) {
        p_Var6 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[~uVar1 >> 0x1f];
    } while (p_Var5 != (_Base_ptr)0x0);
  }
  if (p_Var3 != p_Var6) {
    do {
      local_60 = (TFunction *)(**(code **)(*(long *)p_Var3[2]._M_parent + 0x38))();
      std::vector<glslang::TFunction_const*,glslang::pool_allocator<glslang::TFunction_const*>>::
      emplace_back<glslang::TFunction_const*>
                ((vector<glslang::TFunction_const*,glslang::pool_allocator<glslang::TFunction_const*>>
                  *)list,&local_60);
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while (p_Var3 != p_Var6);
  }
  return;
}

Assistant:

void findFunctionNameList(const TString& name, TVector<const TFunction*>& list)
    {
        size_t parenAt = name.find_first_of('(');
        TString base(name, 0, parenAt + 1);

        tLevel::const_iterator begin = level.lower_bound(base);
        base[parenAt] = ')';  // assume ')' is lexically after '('
        tLevel::const_iterator end = level.upper_bound(base);
        for (tLevel::const_iterator it = begin; it != end; ++it)
            list.push_back(it->second->getAsFunction());
    }